

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
ptc::Print<char32_t>::
print_backend<std::__cxx11::basic_ostringstream<char32_t,std::char_traits<char32_t>,std::allocator<char32_t>>&,char_const(&)[8],char_const(&)[5]>
          (Print<char32_t> *this,
          basic_ostringstream<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *os,
          char (*first) [8],char (*args) [5])

{
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *__str;
  basic_ostream<char32_t,_std::char_traits<char32_t>_> *pbVar1;
  
  std::mutex::lock((mutex *)mutex_);
  __str = &this->pattern;
  if ((this->pattern)._M_string_length == 0) {
    std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,*first);
  }
  else {
    pbVar1 = std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,__str);
    pbVar1 = std::operator<<(pbVar1,*first);
    std::operator<<(pbVar1,__str);
  }
  if ((this->pattern)._M_string_length == 0) {
    pbVar1 = std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,
                             &this->sep);
    std::operator<<(pbVar1,*args);
  }
  else {
    pbVar1 = std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,
                             &this->sep);
    pbVar1 = std::operator<<(pbVar1,__str);
    pbVar1 = std::operator<<(pbVar1,*args);
    std::operator<<(pbVar1,__str);
  }
  std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,&this->end);
  if (this->flush == true) {
    std::basic_ostream<char32_t,_std::char_traits<char32_t>_>::flush
              (&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>);
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }